

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O0

drwav_uint64 drwav_read_f32(drwav *pWav,drwav_uint64 samplesToRead,float *pBufferOut)

{
  long in_RDX;
  long in_RSI;
  long in_RDI;
  float *in_stack_00001000;
  float *in_stack_00001008;
  drwav *in_stack_00001010;
  drwav *in_stack_00001018;
  undefined8 local_8;
  
  if (((in_RDI == 0) || (in_RSI == 0)) || (in_RDX == 0)) {
    local_8 = 0;
  }
  else if (*(short *)(in_RDI + 0x54) == 1) {
    local_8 = drwav_read_f32__pcm(in_stack_00001018,(drwav_uint64)in_stack_00001010,
                                  in_stack_00001008);
  }
  else if (*(short *)(in_RDI + 0x54) == 2) {
    local_8 = drwav_read_f32__msadpcm
                        (in_stack_00001010,(drwav_uint64)in_stack_00001008,in_stack_00001000);
  }
  else if (*(short *)(in_RDI + 0x54) == 3) {
    local_8 = drwav_read_f32__ieee
                        (in_stack_00001018,(drwav_uint64)in_stack_00001010,in_stack_00001008);
  }
  else if (*(short *)(in_RDI + 0x54) == 6) {
    local_8 = drwav_read_f32__alaw
                        (in_stack_00001018,(drwav_uint64)in_stack_00001010,in_stack_00001008);
  }
  else if (*(short *)(in_RDI + 0x54) == 7) {
    local_8 = drwav_read_f32__mulaw
                        (in_stack_00001018,(drwav_uint64)in_stack_00001010,in_stack_00001008);
  }
  else if (*(short *)(in_RDI + 0x54) == 0x11) {
    local_8 = drwav_read_f32__ima(in_stack_00001010,(drwav_uint64)in_stack_00001008,
                                  in_stack_00001000);
  }
  else {
    local_8 = 0;
  }
  return local_8;
}

Assistant:

drwav_uint64 drwav_read_f32(drwav* pWav, drwav_uint64 samplesToRead, float* pBufferOut)
{
    if (pWav == NULL || samplesToRead == 0 || pBufferOut == NULL) {
        return 0;
    }

    // Don't try to read more samples than can potentially fit in the output buffer.
    if (samplesToRead * sizeof(float) > DRWAV_SIZE_MAX) {
        samplesToRead = DRWAV_SIZE_MAX / sizeof(float);
    }

    if (pWav->translatedFormatTag == DR_WAVE_FORMAT_PCM) {
        return drwav_read_f32__pcm(pWav, samplesToRead, pBufferOut);
    }

    if (pWav->translatedFormatTag == DR_WAVE_FORMAT_ADPCM) {
        return drwav_read_f32__msadpcm(pWav, samplesToRead, pBufferOut);
    }

    if (pWav->translatedFormatTag == DR_WAVE_FORMAT_IEEE_FLOAT) {
        return drwav_read_f32__ieee(pWav, samplesToRead, pBufferOut);
    }

    if (pWav->translatedFormatTag == DR_WAVE_FORMAT_ALAW) {
        return drwav_read_f32__alaw(pWav, samplesToRead, pBufferOut);
    }

    if (pWav->translatedFormatTag == DR_WAVE_FORMAT_MULAW) {
        return drwav_read_f32__mulaw(pWav, samplesToRead, pBufferOut);
    }

    if (pWav->translatedFormatTag == DR_WAVE_FORMAT_DVI_ADPCM) {
        return drwav_read_f32__ima(pWav, samplesToRead, pBufferOut);
    }

    return 0;
}